

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::block(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  _Rb_tree_header *p_Var1;
  long *plVar2;
  char cVar3;
  _Rb_tree_color _Var4;
  uint uVar5;
  _Base_ptr p_Var6;
  basic_fstream<char,_std::char_traits<char>_> *pbVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  long lVar10;
  bool bVar11;
  Cell u;
  string fileContent;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  char buffer [1024];
  _Rb_tree_color local_46c;
  long *local_468;
  uint local_460;
  undefined4 uStack_45c;
  long local_458 [2];
  basic_fstream<char,_std::char_traits<char>_> *local_448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  undefined1 local_438 [1032];
  
  requireDStackDepth(this,1,"BLOCK");
  requireDStackAvailable(this,1,"BLOCK");
  this_00 = &this->dStack;
  _Var4 = ForthStack<unsigned_int>::getTop(this_00);
  if (_Var4 == _S_red) {
    return;
  }
  p_Var9 = (this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_46c = _Var4;
  if (p_Var9 != (_Base_ptr)0x0) {
    p_Var1 = &(this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      bVar11 = p_Var9[1]._M_color < _Var4;
      if (!bVar11) {
        p_Var6 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[bVar11];
    } while (p_Var9 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var6[1]._M_color <= _Var4)) {
      ForthStack<unsigned_int>::setTop(this_00,*(uint *)&p_Var6[1]._M_parent);
      local_46c = _Var4;
      goto LAB_0011d0ce;
    }
  }
  pbVar7 = (basic_fstream<char,_std::char_traits<char>_> *)operator_new(0x210);
  std::fstream::fstream(pbVar7,(string *)&this->blockFileName,_S_in|_S_bin);
  local_448 = pbVar7;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::fstream*>(&local_440,pbVar7);
  pbVar7 = local_448;
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    std::istream::seekg((long)pbVar7,(_Var4 - _S_black) * 0x400);
    std::istream::read((char *)local_448,(long)local_438);
    lVar10 = *(long *)(local_448 + 8);
    std::fstream::close();
    local_468 = local_458;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_468,local_438,local_438 + lVar10);
    ForthStack<unsigned_int>::setTop(this_00,local_460);
    memAllocate(this);
    ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    uVar5 = ForthStack<unsigned_int>::getTop(this_00);
    plVar2 = local_468;
    if (CONCAT44(uStack_45c,local_460) != 0) {
      lVar10 = 0;
      do {
        dataSpaceSet(this,uVar5 + (int)lVar10,*(Char *)((long)plVar2 + lVar10));
        lVar10 = lVar10 + 1;
      } while (CONCAT44(uStack_45c,local_460) != lVar10);
    }
    pmVar8 = std::
             map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
             ::operator[](&this->blocksInProcess,&local_46c);
    pmVar8->blockNumber = _Var4;
    pmVar8->blockLocation = uVar5;
    *(undefined4 *)&pmVar8->blockModified = 0;
    if (local_468 != local_458) {
      operator_delete(local_468,local_458[0] + 1);
    }
  }
  if (local_440._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_440._M_pi);
  }
LAB_0011d0ce:
  this->blockCurrent = local_46c;
  return;
}

Assistant:

void block(){
			REQUIRE_DSTACK_DEPTH(1, "BLOCK");
			REQUIRE_DSTACK_AVAILABLE(1, "BLOCK");
			Cell u=dStack.getTop();
			if(u>0){
				auto foundIt=blocksInProcess.find(u);
				if(foundIt!=blocksInProcess.end()){
					dStack.setTop((*foundIt).second.blockLocation);	
				} else {	
				std::shared_ptr<std::fstream> f{ new std::fstream(blockFileName, std::ios_base::in | std::ios_base::binary) };
					if (f->is_open()) {
						f->seekg(static_cast<size_t>(u-1)*1024L , std::ios_base::beg);
						char buffer[1024];
						f->read(buffer,1024);   // read from the file
						auto readBytes=f->gcount();
						f->close();
						std::string fileContent{buffer,static_cast<size_t>(readBytes)};
						// get memory
						dStack.setTop(fileContent.size());
						memAllocate();	
						auto ec=dStack.getTop();pop();
						// copy to memory
						auto address=dStack.getTop();
						moveIntoDataSpace(address,fileContent.c_str(),fileContent.size());
						// save block info
						struct BlockInfo newBlock {};
						newBlock.blockNumber = u;
						newBlock.blockLocation = address;
						newBlock.blockModified = false;
						blocksInProcess[u] = newBlock;
						// push address - address already on stack top
					}
				}
				blockCurrent = u;
			}
		}